

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_compressSeqStore_singleBlock
                 (ZSTD_CCtx *zc,seqStore_t *seqStore,repcodes_t *dRep,repcodes_t *cRep,void *dst,
                 size_t dstCapacity,void *src,size_t srcSize,U32 lastBlock,U32 isPartition)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 uVar5;
  U32 UVar6;
  uint offBase;
  undefined8 uVar7;
  seqDef *psVar8;
  ZSTD_compressedBlockState_t *pZVar9;
  bool bVar10;
  U32 UVar11;
  U32 UVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  uint ll0;
  size_t err_code;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  BYTE *op;
  repcodes_t dRepOriginal;
  
  UVar6 = dRep->rep[2];
  uVar7 = *(undefined8 *)dRep->rep;
  if (isPartition != 0) {
    uVar14 = (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3;
    uVar15 = (uint)uVar14;
    if (seqStore->longLengthType == ZSTD_llt_literalLength) {
      uVar15 = seqStore->longLengthPos;
    }
    for (uVar16 = 0; (uVar14 & 0xffffffff) != uVar16; uVar16 = uVar16 + 1) {
      psVar8 = seqStore->sequencesStart;
      offBase = psVar8[uVar16].offBase;
      if (offBase == 0) {
        __assert_fail("offBase > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0xf4f,
                      "void ZSTD_seqStore_resolveOffCodes(repcodes_t *const, repcodes_t *const, const seqStore_t *const, const U32)"
                     );
      }
      bVar10 = psVar8[uVar16].litLength == 0 && uVar15 != uVar16;
      ll0 = (uint)bVar10;
      UVar12 = offBase;
      if (offBase < 4) {
        UVar11 = ZSTD_resolveRepcodeToRawOffset(dRep->rep,offBase,ll0);
        UVar12 = ZSTD_resolveRepcodeToRawOffset(cRep->rep,offBase,(uint)bVar10);
        if (UVar11 == UVar12) {
          UVar12 = psVar8[uVar16].offBase;
        }
        else {
          if (UVar12 == 0) {
            __assert_fail("(cRawOffset)>0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                          ,0xf58,
                          "void ZSTD_seqStore_resolveOffCodes(repcodes_t *const, repcodes_t *const, const seqStore_t *const, const U32)"
                         );
          }
          UVar12 = UVar12 + 3;
          psVar8[uVar16].offBase = UVar12;
        }
      }
      ZSTD_updateRep(dRep->rep,UVar12,ll0);
      ZSTD_updateRep(cRep->rep,offBase,ll0);
    }
  }
  uVar14 = 0xffffffffffffffba;
  if (2 < dstCapacity) {
    uVar14 = ZSTD_entropyCompressSeqStore
                       (seqStore,&((zc->blockState).prevCBlock)->entropy,
                        &((zc->blockState).nextCBlock)->entropy,&zc->appliedParams,
                        (void *)((long)dst + 3),dstCapacity - 3,srcSize,zc->entropyWorkspace,
                        (ulong)(uint)zc->bmi2,-0x46);
    if (uVar14 < 0xffffffffffffff89) {
      if ((uVar14 < 0x19) && (zc->isFirstBlock == 0)) {
        iVar13 = ZSTD_isRLE((BYTE *)src,srcSize);
        if (iVar13 != 0) {
          uVar14 = 1;
        }
      }
      if ((zc->seqCollector).collectSequences == 0) {
        if (uVar14 == 1) {
          if (dstCapacity == 3) {
            return 0xffffffffffffffba;
          }
          uVar5 = *src;
          iVar13 = lastBlock + (int)srcSize * 8 + 2;
          *(short *)dst = (short)iVar13;
          *(char *)((long)dst + 2) = (char)((uint)iVar13 >> 0x10);
          *(undefined1 *)((long)dst + 3) = uVar5;
          dRep->rep[2] = UVar6;
          *(undefined8 *)dRep->rep = uVar7;
          uVar14 = 4;
        }
        else if (uVar14 == 0) {
          uVar14 = srcSize + 3;
          if (dstCapacity < uVar14) {
            return 0xffffffffffffffba;
          }
          iVar13 = lastBlock + (int)srcSize * 8;
          *(short *)dst = (short)iVar13;
          *(char *)((long)dst + 2) = (char)((uint)iVar13 >> 0x10);
          memcpy((void *)((long)dst + 3),src,srcSize);
          if (0xffffffffffffff88 < uVar14) {
            return uVar14;
          }
          dRep->rep[2] = UVar6;
          *(undefined8 *)dRep->rep = uVar7;
        }
        else {
          uVar2 = (zc->blockState).prevCBlock;
          uVar4 = (zc->blockState).nextCBlock;
          auVar18._8_4_ = (int)uVar2;
          auVar18._0_8_ = uVar4;
          auVar18._12_4_ = (int)((ulong)uVar2 >> 0x20);
          (zc->blockState).prevCBlock = (ZSTD_compressedBlockState_t *)uVar4;
          (zc->blockState).nextCBlock = (ZSTD_compressedBlockState_t *)auVar18._8_8_;
          iVar13 = lastBlock + (int)uVar14 * 8 + 4;
          *(short *)dst = (short)iVar13;
          *(char *)((long)dst + 2) = (char)((uint)iVar13 >> 0x10);
          uVar14 = uVar14 + 3;
        }
        pZVar9 = (zc->blockState).prevCBlock;
        if ((pZVar9->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
          (pZVar9->entropy).fse.offcode_repeatMode = FSE_repeat_check;
        }
      }
      else {
        ZSTD_copyBlockSequences(zc);
        uVar1 = (zc->blockState).prevCBlock;
        uVar3 = (zc->blockState).nextCBlock;
        auVar17._8_4_ = (int)uVar1;
        auVar17._0_8_ = uVar3;
        auVar17._12_4_ = (int)((ulong)uVar1 >> 0x20);
        (zc->blockState).prevCBlock = (ZSTD_compressedBlockState_t *)uVar3;
        (zc->blockState).nextCBlock = (ZSTD_compressedBlockState_t *)auVar17._8_8_;
        uVar14 = 0;
      }
    }
  }
  return uVar14;
}

Assistant:

static size_t
ZSTD_compressSeqStore_singleBlock(ZSTD_CCtx* zc,
                            const seqStore_t* const seqStore,
                                  repcodes_t* const dRep, repcodes_t* const cRep,
                                  void* dst, size_t dstCapacity,
                            const void* src, size_t srcSize,
                                  U32 lastBlock, U32 isPartition)
{
    const U32 rleMaxLength = 25;
    BYTE* op = (BYTE*)dst;
    const BYTE* ip = (const BYTE*)src;
    size_t cSize;
    size_t cSeqsSize;

    /* In case of an RLE or raw block, the simulated decompression repcode history must be reset */
    repcodes_t const dRepOriginal = *dRep;
    DEBUGLOG(5, "ZSTD_compressSeqStore_singleBlock");
    if (isPartition)
        ZSTD_seqStore_resolveOffCodes(dRep, cRep, seqStore, (U32)(seqStore->sequences - seqStore->sequencesStart));

    RETURN_ERROR_IF(dstCapacity < ZSTD_blockHeaderSize, dstSize_tooSmall, "Block header doesn't fit");
    cSeqsSize = ZSTD_entropyCompressSeqStore(seqStore,
                &zc->blockState.prevCBlock->entropy, &zc->blockState.nextCBlock->entropy,
                &zc->appliedParams,
                op + ZSTD_blockHeaderSize, dstCapacity - ZSTD_blockHeaderSize,
                srcSize,
                zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */,
                zc->bmi2);
    FORWARD_IF_ERROR(cSeqsSize, "ZSTD_entropyCompressSeqStore failed!");

    if (!zc->isFirstBlock &&
        cSeqsSize < rleMaxLength &&
        ZSTD_isRLE((BYTE const*)src, srcSize)) {
        /* We don't want to emit our first block as a RLE even if it qualifies because
        * doing so will cause the decoder (cli only) to throw a "should consume all input error."
        * This is only an issue for zstd <= v1.4.3
        */
        cSeqsSize = 1;
    }

    if (zc->seqCollector.collectSequences) {
        ZSTD_copyBlockSequences(zc);
        ZSTD_blockState_confirmRepcodesAndEntropyTables(&zc->blockState);
        return 0;
    }

    if (cSeqsSize == 0) {
        cSize = ZSTD_noCompressBlock(op, dstCapacity, ip, srcSize, lastBlock);
        FORWARD_IF_ERROR(cSize, "Nocompress block failed");
        DEBUGLOG(4, "Writing out nocompress block, size: %zu", cSize);
        *dRep = dRepOriginal; /* reset simulated decompression repcode history */
    } else if (cSeqsSize == 1) {
        cSize = ZSTD_rleCompressBlock(op, dstCapacity, *ip, srcSize, lastBlock);
        FORWARD_IF_ERROR(cSize, "RLE compress block failed");
        DEBUGLOG(4, "Writing out RLE block, size: %zu", cSize);
        *dRep = dRepOriginal; /* reset simulated decompression repcode history */
    } else {
        ZSTD_blockState_confirmRepcodesAndEntropyTables(&zc->blockState);
        writeBlockHeader(op, cSeqsSize, srcSize, lastBlock);
        cSize = ZSTD_blockHeaderSize + cSeqsSize;
        DEBUGLOG(4, "Writing out compressed block, size: %zu", cSize);
    }

    if (zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode == FSE_repeat_valid)
        zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode = FSE_repeat_check;

    return cSize;
}